

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::reset(CmdLine *this)

{
  bool bVar1;
  reference ppAVar2;
  iterator local_30;
  _List_const_iterator<TCLAP::Arg_*> local_28;
  iterator local_20;
  _List_const_iterator<TCLAP::Arg_*> local_18;
  ArgListIterator it;
  CmdLine *this_local;
  
  it._M_node = (_List_node_base *)this;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(&this->_argList);
  std::_List_const_iterator<TCLAP::Arg_*>::_List_const_iterator(&local_18,&local_20);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(&this->_argList);
    std::_List_const_iterator<TCLAP::Arg_*>::_List_const_iterator(&local_28,&local_30);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppAVar2 = std::_List_const_iterator<TCLAP::Arg_*>::operator*(&local_18);
    (*(*ppAVar2)->_vptr_Arg[0xd])();
    std::_List_const_iterator<TCLAP::Arg_*>::operator++(&local_18,0);
  }
  std::__cxx11::string::clear();
  return;
}

Assistant:

inline void CmdLine::reset()
{
	for( ArgListIterator it = _argList.begin(); it != _argList.end(); it++ )
		(*it)->reset();
	
	_progName.clear();
}